

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int session_detach_stream_item(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  
  iVar1 = nghttp2_stream_detach_item(stream);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (((stream->flags & 0x10) != 0) && (stream->queued != '\0')) {
      session_ob_data_remove(session,stream);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int session_detach_stream_item(nghttp2_session *session,
                                      nghttp2_stream *stream) {
  int rv;

  rv = nghttp2_stream_detach_item(stream);
  if (rv != 0) {
    return rv;
  }

  if (!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) ||
      !stream->queued) {
    return 0;
  }

  return session_ob_data_remove(session, stream);
}